

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

byte_string_view __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
as_byte_string_view(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this
                   )

{
  int64_t iVar1;
  byte bVar2;
  json_runtime_error<std::domain_error,_void> *this_00;
  size_t in_RDX;
  byte *in_RSI;
  byte_string_view bVar3;
  string local_38;
  
  for (; (bVar2 = *in_RSI & 0xf, bVar2 == 8 || (bVar2 == 9)); in_RSI = *(byte **)(in_RSI + 8)) {
  }
  if (bVar2 == 0xc) {
    iVar1 = *(int64_t *)(*(long *)(in_RSI + 8) + 0x18);
    *(undefined8 *)&this->field_0 = *(undefined8 *)(*(long *)(in_RSI + 8) + 0x10);
    (this->field_0).int64_.val_ = iVar1;
    bVar3.size_ = in_RDX;
    bVar3.data_ = (uint8_t *)this;
    return bVar3;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not a byte string","");
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

byte_string_view as_byte_string_view() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                    return byte_string_view(cast<byte_string_storage>().data(),cast<byte_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_byte_string_view();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_byte_string_view();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a byte string"));
            }
        }